

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O0

void __thiscall
OSTEI_HRR_Algorithm_Base::Create
          (OSTEI_HRR_Algorithm_Base *this,set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *am)

{
  int *piVar1;
  RRStepType ketsteptype;
  RRStepType brasteptype;
  QAM highest_am;
  RRStepType in_stack_00000670;
  RRStepType in_stack_00000674;
  set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *in_stack_00000678;
  OSTEI_HRR_Algorithm_Base *in_stack_00000680;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int iVar2;
  
  std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::rbegin
            ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  std::reverse_iterator<std::_Rb_tree_const_iterator<QAM>_>::operator*
            ((reverse_iterator<std::_Rb_tree_const_iterator<QAM>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  QAM::QAM((QAM *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
           (QAM *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  QAM::operator[]((QAM *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                  in_stack_ffffffffffffff1c);
  QAM::operator[]((QAM *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                  in_stack_ffffffffffffff1c);
  piVar1 = QAM::operator[]((QAM *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           in_stack_ffffffffffffff1c);
  iVar2 = *piVar1;
  QAM::operator[]((QAM *)CONCAT44(iVar2,in_stack_ffffffffffffff20),in_stack_ffffffffffffff1c);
  std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::set
            ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
             CONCAT44(iVar2,in_stack_ffffffffffffff20),
             (set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  Create(in_stack_00000680,in_stack_00000678,in_stack_00000674,in_stack_00000670);
  std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::~set
            ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)0x1354e9);
  QAM::~QAM((QAM *)0x1354f6);
  return;
}

Assistant:

void OSTEI_HRR_Algorithm_Base::Create(std::set<QAM> am)
{
    QAM highest_am = *(am.rbegin());
	
    // What direction are we going for the bra?
	RRStepType brasteptype = RRStepType::J;  // Moving I->J
	if(highest_am[0] < highest_am[1])
	    brasteptype = RRStepType::I; // Moving J->I

	// What direction are we going for the ket?
	RRStepType ketsteptype = RRStepType::L;  // Moving K->L
	if(highest_am[2] < highest_am[3])
	    ketsteptype = RRStepType::K; // Moving L->K

    Create(am, brasteptype, ketsteptype);
}